

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O3

void __thiscall chatra::WaitContext::restoreReferences(WaitContext *this,Reader *r)

{
  Target *pTVar1;
  Reference RVar2;
  EventObject *pEVar3;
  pointer puVar4;
  ulong uVar5;
  
  RVar2 = Reader::readReference(r);
  (this->self).node = RVar2.node;
  puVar4 = (this->targets).
           super__Vector_base<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>,_std::allocator<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->targets).
      super__Vector_base<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>,_std::allocator<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar4) {
    uVar5 = 0;
    do {
      (puVar4[uVar5]._M_t.
       super___uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
       ._M_t.
       super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
       .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>._M_head_impl)->ct = this;
      pEVar3 = derefAsEventObject((this->super_Object).refsArray.
                                  super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5].node);
      (puVar4[uVar5]._M_t.
       super___uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
       ._M_t.
       super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
       .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>._M_head_impl)->eventObject =
           pEVar3;
      pTVar1 = puVar4[uVar5]._M_t.
               super___uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
               ._M_t.
               super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
               .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>._M_head_impl;
      EventObject::registerWatcher(pTVar1->eventObject,pTVar1,WaitContextEventWatcher);
      pTVar1 = puVar4[uVar5]._M_t.
               super___uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
               ._M_t.
               super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
               .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>._M_head_impl;
      EventObject::activateWatcher(pTVar1->eventObject,pTVar1);
      uVar5 = uVar5 + 1;
      puVar4 = (this->targets).
               super__Vector_base<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>,_std::allocator<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->targets).
                                   super__Vector_base<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>,_std::allocator<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3));
  }
  return;
}

Assistant:

void WaitContext::restoreReferences(Reader& r) {
	self = r.readReference();

	for (size_t i = 0; i < targets.size(); i++) {
		auto& t = targets[i];
		t->ct = this;
		t->eventObject = derefAsEventObject(ref(i));
		t->eventObject->registerWatcher(t.get(), WaitContextEventWatcher);
		t->eventObject->activateWatcher(t.get());
	}
}